

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.hpp
# Opt level: O2

void __thiscall ot::commissioner::JoinerSession::~JoinerSession(JoinerSession *this)

{
  coap::Resource::~Resource(&this->mResourceJoinFin);
  coap::Coap::~Coap(&this->mCoap);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->mDtlsSession).
              super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->mRelaySocket).
              super___shared_ptr<ot::commissioner::JoinerSession::RelaySocket,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&this->mJoinerPSKd);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->mJoinerId).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<ot::commissioner::JoinerSession>)._M_weak_this.
              super___weak_ptr<ot::commissioner::JoinerSession,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

~JoinerSession()                                      = default;